

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

Parent * __thiscall
kj::_::BTreeImpl::insertHelper<kj::_::BTreeImpl::Parent>
          (BTreeImpl *this,SearchKey *searchKey,Parent *node,Parent *parent,uint indexInParent,
          uint pos)

{
  Parent *pPVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  NodeUnion *pNVar5;
  NodeUnion *pNVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined8 uVar18;
  uint i;
  uint uVar19;
  int iVar20;
  
  if (node->keys[6].i != 0) {
    uVar3 = this->freelistHead;
    pNVar5 = this->tree;
    pPVar1 = (Parent *)(pNVar5 + uVar3);
    uVar4 = this->freelistSize;
    uVar19 = pNVar5[uVar3].field_0.freelist.nextOffset + uVar3 + 1;
    this->freelistHead = uVar19;
    this->freelistSize = uVar4 - 1;
    if (parent == (Parent *)0x0) {
      this->freelistHead = pNVar5[uVar19].field_0.freelist.nextOffset + uVar19 + 1;
      this->freelistSize = uVar4 - 2;
      uVar4 = node->keys[3].i;
      pNVar5[uVar19].field_0.freelist.zero[2] = node->keys[6].i;
      *(undefined8 *)((long)&pNVar5[uVar19].field_0 + 4) = *(undefined8 *)(node->keys + 4);
      node->keys[3] = 0;
      node->keys[4] = 0;
      node->keys[5] = 0;
      node->keys[6] = 0;
      uVar18 = *(undefined8 *)(node->children + 6);
      puVar2 = (undefined8 *)((long)&pNVar5[uVar19].field_0 + 0x20);
      *puVar2 = *(undefined8 *)(node->children + 4);
      puVar2[1] = uVar18;
      node->children[4] = 0;
      node->children[5] = 0;
      node->children[6] = 0;
      node->children[7] = 0;
      pPVar1->children[4] = 0;
      pPVar1->children[5] = 0;
      pPVar1->children[6] = 0;
      pPVar1->children[7] = 0;
      uVar7 = node->unused;
      uVar8 = node->keys[0].i;
      uVar9 = node->keys[1].i;
      uVar10 = node->keys[2].i;
      uVar11 = node->keys[3].i;
      uVar12 = node->keys[4].i;
      uVar13 = node->keys[5].i;
      uVar14 = node->keys[6].i;
      uVar15 = node->children[1];
      uVar16 = node->children[2];
      uVar17 = node->children[3];
      pPVar1->children[0] = node->children[0];
      pPVar1->children[1] = uVar15;
      pPVar1->children[2] = uVar16;
      pPVar1->children[3] = uVar17;
      pPVar1->keys[3].i = uVar11;
      pPVar1->keys[4].i = uVar12;
      pPVar1->keys[5].i = uVar13;
      pPVar1->keys[6].i = uVar14;
      pPVar1->unused = uVar7;
      pPVar1->keys[0].i = uVar8;
      pPVar1->keys[1].i = uVar9;
      pPVar1->keys[2].i = uVar10;
      pNVar6 = this->tree;
      (pNVar6->field_0).freelist.zero[0] = uVar4;
      (pNVar6->field_0).freelist.zero[7] = uVar3;
      (pNVar6->field_0).freelist.zero[8] = uVar19;
      *(undefined8 *)((long)&pNVar6->field_0 + 8) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x10) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x18) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x28) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x30) = 0;
      *(undefined8 *)((long)&pNVar6->field_0 + 0x38) = 0;
      this->height = this->height + 1;
      iVar20 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)(uVar4 - 1));
      node = (Parent *)(pNVar5 + uVar19);
      if ((char)iVar20 == '\0') {
        node = pPVar1;
      }
    }
    else {
      uVar4 = node->keys[3].i;
      pPVar1->keys[2].i = node->keys[6].i;
      *(undefined8 *)pPVar1->keys = *(undefined8 *)(node->keys + 4);
      node->keys[3] = 0;
      node->keys[4] = 0;
      node->keys[5] = 0;
      node->keys[6] = 0;
      uVar18 = *(undefined8 *)(node->children + 6);
      *(undefined8 *)pPVar1->children = *(undefined8 *)(node->children + 4);
      *(undefined8 *)(pPVar1->children + 2) = uVar18;
      node->children[4] = 0;
      node->children[5] = 0;
      node->children[6] = 0;
      node->children[7] = 0;
      memmove(parent->keys + (ulong)indexInParent + 1,parent->keys + indexInParent,
              (ulong)(indexInParent + 1) * -4 + 0x1c);
      ((Parent *)(parent->keys + (ulong)indexInParent + 1 + -1))->unused = uVar4;
      memmove(parent->children + (ulong)indexInParent + 2,
              parent->children + (ulong)indexInParent + 1,(ulong)(indexInParent + 2) * -4 + 0x20);
      parent->children[indexInParent + 1] = uVar3;
      iVar20 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)(uVar4 - 1));
      if ((char)iVar20 != '\0') {
        node = pPVar1;
      }
    }
  }
  return node;
}

Assistant:

Node& BTreeImpl::insertHelper(const SearchKey& searchKey,
    Node& node, Parent* parent, uint indexInParent, uint pos) {
  if (node.isFull()) {
    // This node is full. Need to split.
    if (parent == nullptr) {
      // This is the root node. We need to split into two nodes and create a new root.
      auto n1 = alloc<Node>();
      auto n2 = alloc<Node>();

      uint pivot = split(n2.node, n2.index, node, pos);
      move(n1.node, n1.index, node);

      // Rewrite root to have the two children.
      tree[0].parent.initRoot(pivot, n1.index, n2.index);

      // Increased height.
      ++height;

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the right one
        return n2.node;
      } else {
        // the left one
        return n1.node;
      }
    } else {
      // This is a non-root parent node. We need to split it into two and insert the new node
      // into the grandparent.
      auto n = alloc<Node>();
      uint pivot = split(n.node, n.index, node, pos);

      // Insert new child into grandparent.
      parent->insertAfter(indexInParent, pivot, n.index);

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the new one, which is right of the original
        return n.node;
      } else {
        // the original one, which is left of the new one
        return node;
      }
    }
  } else {
    // No split needed.
    return node;
  }
}